

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZGeoLinear.h
# Opt level: O2

void pzgeom::TPZGeoLinear::X<Fad<double>>
               (TPZFMatrix<double> *nodes,TPZVec<Fad<double>_> *loc,TPZVec<Fad<double>_> *x)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>_>_>
  local_110;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>
  local_100;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
  local_e0;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
  local_c8;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
  local_a8;
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> local_90;
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> local_70;
  Fad<double> xi;
  
  Fad<double>::Fad(&xi,loc->fStore);
  uVar1 = (uint)(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  uVar4 = 0;
  uVar3 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar3 = uVar4;
  }
  for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    (*(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24])
              (nodes,uVar2,0);
    local_70.fadexpr_.left_.constant_ = 1.0;
    local_70.fadexpr_.left_.defaultVal = 0.0;
    local_c8.fadexpr_.left_.defaultVal = 0.0;
    local_c8.fadexpr_.right_ = &local_70;
    local_a8.fadexpr_.left_ = &local_c8;
    local_a8.fadexpr_.right_.constant_ = 0.5;
    local_a8.fadexpr_.right_.defaultVal = 0.0;
    local_70.fadexpr_.right_ = &xi;
    (*(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24])
              (nodes,uVar2,1);
    local_90.fadexpr_.left_.constant_ = 1.0;
    local_90.fadexpr_.left_.defaultVal = 0.0;
    local_100.fadexpr_.left_.defaultVal = 0.0;
    local_100.fadexpr_.right_ = &local_90;
    local_e0.fadexpr_.left_ = &local_100;
    local_e0.fadexpr_.right_.constant_ = 0.5;
    local_e0.fadexpr_.right_.defaultVal = 0.0;
    local_110.fadexpr_.left_ = &local_a8;
    local_110.fadexpr_.right_ = &local_e0;
    local_90.fadexpr_.right_ = &xi;
    Fad<double>::operator=((Fad<double> *)((long)&x->fStore->val_ + uVar4),&local_110);
    uVar4 = uVar4 + 0x20;
  }
  Fad<double>::~Fad(&xi);
  return;
}

Assistant:

inline void TPZGeoLinear::X(const TPZFMatrix<REAL> &nodes,TPZVec<T> &loc,TPZVec<T> &x){
        
        T xi = loc[0];
        int nrow = nodes.Rows();
        for(int i = 0; i < nrow; i++)
        {
            x[i] = nodes.GetVal(i,0)*(1.-xi)*0.5+nodes.GetVal(i,1)*(1.+xi)*0.5;
        }
        
    }